

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

void duckdb::TableScanSerialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               TableFunction *function)

{
  FunctionData *pFVar1;
  string *value;
  _Vector_base<long,_std::allocator<long>_> local_38;
  optional_ptr<duckdb::FunctionData,_true> bind_data_p_local;
  
  bind_data_p_local = bind_data_p;
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&bind_data_p_local);
  value = Catalog::GetName_abi_cxx11_(*(Catalog **)(pFVar1[4]._vptr_FunctionData[0x1c] + 0xd8));
  Serializer::WriteProperty<std::__cxx11::string>(serializer,100,"catalog",value);
  Serializer::WriteProperty<std::__cxx11::string>
            (serializer,0x65,"schema",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pFVar1[4]._vptr_FunctionData[0x1c] + 0x20));
  Serializer::WriteProperty<std::__cxx11::string>
            (serializer,0x66,"table",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pFVar1[4]._vptr_FunctionData + 4));
  Serializer::WriteProperty<bool>(serializer,0x67,"is_index_scan",(bool *)(pFVar1 + 5));
  Serializer::WriteProperty<bool>
            (serializer,0x68,"is_create_index",(bool *)((long)&pFVar1[5]._vptr_FunctionData + 1));
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Serializer::WritePropertyWithDefault<duckdb::vector<long,false>>
            (serializer,0x69,"result_ids",(vector<long,_false> *)&local_38);
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

static void TableScanSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                               const TableFunction &function) {
	auto &bind_data = bind_data_p->Cast<TableScanBindData>();
	serializer.WriteProperty(100, "catalog", bind_data.table.schema.catalog.GetName());
	serializer.WriteProperty(101, "schema", bind_data.table.schema.name);
	serializer.WriteProperty(102, "table", bind_data.table.name);
	serializer.WriteProperty(103, "is_index_scan", bind_data.is_index_scan);
	serializer.WriteProperty(104, "is_create_index", bind_data.is_create_index);
	serializer.WritePropertyWithDefault(105, "result_ids", unsafe_vector<row_t>());
}